

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O1

bool __thiscall
dxil_spv::CFGNode::dominates_all_reachable_exits
          (CFGNode *this,UnorderedSet<const_CFGNode_*> *completed,CFGNode *header)

{
  CFGNode *pCVar1;
  pointer ppCVar2;
  bool bVar3;
  size_type sVar4;
  CFGNode *pCVar5;
  pointer ppCVar6;
  __hashtable *__h;
  bool bVar7;
  __node_gen_type __node_gen;
  CFGNode *local_38;
  CFGNode *local_30;
  
  local_38 = this;
  sVar4 = std::
          _Hashtable<const_dxil_spv::CFGNode_*,_const_dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<const_dxil_spv::CFGNode_*>,_std::__detail::_Identity,_std::equal_to<const_dxil_spv::CFGNode_*>,_std::hash<const_dxil_spv::CFGNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::count(&completed->_M_h,&local_38);
  if (sVar4 == 0) {
    local_38 = (CFGNode *)completed;
    local_30 = this;
    std::
    _Hashtable<dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_const*>,std::__detail::_Identity,std::equal_to<dxil_spv::CFGNode_const*>,std::hash<dxil_spv::CFGNode_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::
    _M_insert<dxil_spv::CFGNode_const*,std::__detail::_AllocNode<dxil_spv::ThreadLocalAllocator<std::__detail::_Hash_node<dxil_spv::CFGNode_const*,false>>>>
              ((_Hashtable<dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_const*>,std::__detail::_Identity,std::equal_to<dxil_spv::CFGNode_const*>,std::hash<dxil_spv::CFGNode_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)completed);
    pCVar1 = this->succ_back_edge;
    if (this->succ_back_edge != (CFGNode *)0x0) {
      do {
        pCVar5 = pCVar1;
        if (pCVar5 == header) goto LAB_0014be45;
        pCVar1 = pCVar5->immediate_dominator;
      } while ((pCVar1 != (CFGNode *)0x0) && (pCVar5 != pCVar1));
      if (pCVar5 != header) {
        return false;
      }
    }
LAB_0014be45:
    ppCVar2 = (this->succ).
              super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (ppCVar6 = (this->succ).
                   super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                   ._M_impl.super__Vector_impl_data._M_start; bVar7 = ppCVar6 != ppCVar2, bVar7;
        ppCVar6 = ppCVar6 + 1) {
      pCVar1 = *ppCVar6;
      do {
        pCVar5 = pCVar1;
        if (pCVar5 == header) goto LAB_0014be81;
        pCVar1 = pCVar5->immediate_dominator;
      } while ((pCVar1 != (CFGNode *)0x0) && (pCVar5 != pCVar1));
      if (pCVar5 != header) {
LAB_0014be96:
        if (!bVar7) {
          return true;
        }
        return false;
      }
LAB_0014be81:
      bVar3 = dominates_all_reachable_exits(*ppCVar6,completed,header);
      if (!bVar3) goto LAB_0014be96;
    }
  }
  return true;
}

Assistant:

bool CFGNode::dominates_all_reachable_exits(UnorderedSet<const CFGNode *> &completed, const CFGNode &header) const
{
	if (!completed.count(this))
	{
		completed.insert(this);
		if (succ_back_edge && !header.dominates(succ_back_edge))
			return false;

		for (auto *node : succ)
			if (!header.dominates(node) || !node->dominates_all_reachable_exits(completed, header))
				return false;
	}

	return true;
}